

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error FT_Match_Size(FT_Face face,FT_Size_Request req,FT_Bool ignore_width,FT_ULong *size_index)

{
  long lVar1;
  FT_Error FVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  FT_ULong FVar7;
  long lVar8;
  ulong uVar9;
  FT_Pos *pFVar10;
  
  FVar2 = 0x23;
  if (((face->face_flags & 2) != 0) && (FVar2 = 7, req->type == FT_SIZE_REQUEST_TYPE_NOMINAL)) {
    lVar1 = req->width;
    lVar8 = lVar1;
    if ((ulong)req->horiResolution != 0) {
      lVar3 = (ulong)req->horiResolution * lVar1 + 0x24;
      lVar8 = lVar3 >> 0x3f;
      lVar8 = (lVar3 / 0x12 + lVar8 >> 2) - lVar8;
    }
    lVar3 = req->height;
    lVar4 = lVar3;
    if ((ulong)req->vertResolution != 0) {
      lVar4 = (long)((ulong)req->vertResolution * lVar3 + 0x24) / 0x48;
    }
    lVar5 = lVar4;
    if (lVar3 == 0) {
      lVar5 = lVar8;
    }
    lVar3 = lVar5;
    if (lVar1 == 0) {
      lVar3 = lVar4;
      lVar8 = lVar5;
    }
    FVar2 = 0x17;
    uVar9 = lVar8 + 0x20U & 0xffffffffffffffc0;
    if (((uVar9 != 0) && (uVar6 = lVar3 + 0x20U & 0xffffffffffffffc0, uVar6 != 0)) &&
       (0 < (long)face->num_fixed_sizes)) {
      pFVar10 = &face->available_sizes->y_ppem;
      FVar7 = 0;
      do {
        if ((uVar6 == (*pFVar10 + 0x20U & 0xffffffffffffffc0)) &&
           ((ignore_width != '\0' || (uVar9 == (pFVar10[-1] + 0x20U & 0xffffffffffffffc0))))) {
          if (size_index == (FT_ULong *)0x0) {
            return 0;
          }
          *size_index = FVar7;
          return 0;
        }
        FVar7 = FVar7 + 1;
        pFVar10 = pFVar10 + 4;
      } while ((long)face->num_fixed_sizes != FVar7);
    }
  }
  return FVar2;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_Match_Size( FT_Face          face,
                 FT_Size_Request  req,
                 FT_Bool          ignore_width,
                 FT_ULong*        size_index )
  {
    FT_Int   i;
    FT_Long  w, h;


    if ( !FT_HAS_FIXED_SIZES( face ) )
      return FT_THROW( Invalid_Face_Handle );

    /* FT_Bitmap_Size doesn't provide enough info... */
    if ( req->type != FT_SIZE_REQUEST_TYPE_NOMINAL )
      return FT_THROW( Unimplemented_Feature );

    w = FT_REQUEST_WIDTH ( req );
    h = FT_REQUEST_HEIGHT( req );

    if ( req->width && !req->height )
      h = w;
    else if ( !req->width && req->height )
      w = h;

    w = FT_PIX_ROUND( w );
    h = FT_PIX_ROUND( h );

    if ( !w || !h )
      return FT_THROW( Invalid_Pixel_Size );

    for ( i = 0; i < face->num_fixed_sizes; i++ )
    {
      FT_Bitmap_Size*  bsize = face->available_sizes + i;


      if ( h != FT_PIX_ROUND( bsize->y_ppem ) )
        continue;

      if ( w == FT_PIX_ROUND( bsize->x_ppem ) || ignore_width )
      {
        FT_TRACE3(( "FT_Match_Size: bitmap strike %d matches\n", i ));

        if ( size_index )
          *size_index = (FT_ULong)i;

        return FT_Err_Ok;
      }
    }

    FT_TRACE3(( "FT_Match_Size: no matching bitmap strike\n" ));

    return FT_THROW( Invalid_Pixel_Size );
  }